

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_exp.cpp
# Opt level: O3

FxExpression * ParseClamp(FScanner *sc,PClassActor *cls)

{
  FxExpression *pFVar1;
  FxExpression *pFVar2;
  FxExpression *pFVar3;
  FxMinMax *pFVar4;
  TArray<FxExpression_*,_FxExpression_*> list;
  TArray<FxExpression_*,_FxExpression_*> local_50;
  FScriptPosition local_40;
  FName local_30;
  FName local_2c;
  
  pFVar1 = ParseExpressionM(sc,cls);
  FScanner::MustGetToken(sc,0x2c);
  pFVar2 = ParseExpressionM(sc,cls);
  FScanner::MustGetToken(sc,0x2c);
  pFVar3 = ParseExpressionM(sc,cls);
  FScanner::MustGetToken(sc,0x29);
  local_50.Most = 2;
  local_50.Count = 0;
  local_50.Array =
       (FxExpression **)
       M_Malloc_Dbg(0x10,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/./tarray.h"
                    ,0x91);
  TArray<FxExpression_*,_FxExpression_*>::Grow(&local_50,2);
  local_50.Count = local_50.Count + 2;
  *local_50.Array = pFVar1;
  local_50.Array[1] = pFVar2;
  pFVar4 = (FxMinMax *)operator_new(0x50);
  local_2c.Index = 0x23b;
  FScriptPosition::FScriptPosition(&local_40,sc);
  FxMinMax::FxMinMax(pFVar4,&local_50,&local_2c,&local_40);
  FString::~FString(&local_40.FileName);
  *local_50.Array = (FxExpression *)pFVar4;
  local_50.Array[1] = pFVar3;
  pFVar4 = (FxMinMax *)operator_new(0x50);
  local_30.Index = 0x23a;
  FScriptPosition::FScriptPosition(&local_40,sc);
  FxMinMax::FxMinMax(pFVar4,&local_50,&local_30,&local_40);
  FString::~FString(&local_40.FileName);
  TArray<FxExpression_*,_FxExpression_*>::~TArray(&local_50);
  return &pFVar4->super_FxExpression;
}

Assistant:

static FxExpression *ParseClamp(FScanner &sc, PClassActor *cls)
{
	FxExpression *src = ParseExpressionM(sc, cls);
	sc.MustGetToken(',');
	FxExpression *min = ParseExpressionM(sc, cls);
	sc.MustGetToken(',');
	FxExpression *max = ParseExpressionM(sc, cls);
	sc.MustGetToken(')');

	// Build clamp(a,x,y) as min(max(a,x),y)
	TArray<FxExpression *> list(2);
	list.Reserve(2);
	list[0] = src;
	list[1] = min;
	FxExpression *maxexpr = new FxMinMax(list, NAME_Max, sc);
	list[0] = maxexpr;
	list[1] = max;
	return new FxMinMax(list, NAME_Min, sc);
}